

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt_codec.c
# Opt level: O2

BUFFER_HANDLE
mqtt_codec_subscribe
          (uint16_t packetId,SUBSCRIBE_PAYLOAD *subscribeList,size_t count,STRING_HANDLE trace_log)

{
  char *__src;
  int iVar1;
  int iVar2;
  BUFFER_HANDLE ctrlPacket;
  size_t sVar3;
  size_t __n;
  uchar *puVar4;
  size_t index;
  ulong uVar5;
  STRING_HANDLE local_48;
  
  if ((count == 0 || subscribeList == (SUBSCRIBE_PAYLOAD *)0x0) ||
     (ctrlPacket = BUFFER_new(), ctrlPacket == (BUFFER_HANDLE)0x0)) {
    return (BUFFER_HANDLE)0x0;
  }
  iVar1 = constructSubscibeTypeVariableHeader(ctrlPacket,packetId);
  if (iVar1 != 0) {
    BUFFER_delete(ctrlPacket);
    return (BUFFER_HANDLE)0x0;
  }
  iVar1 = 0;
  if (trace_log == (STRING_HANDLE)0x0) {
    local_48 = (STRING_HANDLE)0x0;
  }
  else {
    local_48 = STRING_construct_sprintf(" | PACKET_ID: %u",(ulong)packetId);
  }
  uVar5 = 0;
  while ((uVar5 < count && (iVar1 == 0))) {
    sVar3 = BUFFER_length(ctrlPacket);
    __n = strlen(subscribeList->subscribeTopic);
    iVar1 = 0xae;
    if (__n < 0x10000) {
      iVar2 = BUFFER_enlarge(ctrlPacket,__n + 3);
      iVar1 = 0xb2;
      if (iVar2 == 0) {
        puVar4 = BUFFER_u_char(ctrlPacket);
        __src = subscribeList->subscribeTopic;
        *(ushort *)(puVar4 + sVar3) = (ushort)__n << 8 | (ushort)__n >> 8;
        memcpy(puVar4 + sVar3 + 2,__src,__n);
        puVar4[__n + 2 + sVar3] = (char)subscribeList->qosReturn;
        if (local_48 == (STRING_HANDLE)0x0) {
          iVar1 = 0;
        }
        else {
          iVar1 = 0;
          STRING_sprintf(local_48," | TOPIC_NAME: %s | QOS: %d",subscribeList->subscribeTopic,
                         (ulong)(uint)subscribeList->qosReturn);
        }
      }
    }
    uVar5 = uVar5 + 1;
    subscribeList = subscribeList + 1;
  }
  if (iVar1 == 0) {
    if (trace_log != (STRING_HANDLE)0x0) {
      STRING_concat(trace_log,"SUBSCRIBE");
    }
    iVar1 = constructFixedHeader(ctrlPacket,SUBSCRIBE_TYPE,'\x02');
    if (iVar1 == 0) {
      if (trace_log != (STRING_HANDLE)0x0) {
        STRING_concat_with_STRING(trace_log,local_48);
      }
      goto LAB_001143a2;
    }
  }
  BUFFER_delete(ctrlPacket);
  ctrlPacket = (BUFFER_HANDLE)0x0;
LAB_001143a2:
  if (local_48 != (STRING_HANDLE)0x0) {
    STRING_delete(local_48);
    return ctrlPacket;
  }
  return ctrlPacket;
}

Assistant:

BUFFER_HANDLE mqtt_codec_subscribe(uint16_t packetId, SUBSCRIBE_PAYLOAD* subscribeList, size_t count, STRING_HANDLE trace_log)
{
    BUFFER_HANDLE result;
    /* Codes_SRS_MQTT_CODEC_07_023: [If the parameters subscribeList is NULL or if count is 0 then mqtt_codec_subscribe shall return NULL.] */
    if (subscribeList == NULL || count == 0)
    {
        result = NULL;
    }
    else
    {
        /* Codes_SRS_MQTT_CODEC_07_026: [mqtt_codec_subscribe shall return a BUFFER_HANDLE that represents a MQTT SUBSCRIBE message.]*/
        result = BUFFER_new();
        if (result != NULL)
        {
            if (constructSubscibeTypeVariableHeader(result, packetId) != 0)
            {
                /* Codes_SRS_MQTT_CODEC_07_025: [If any error is encountered then mqtt_codec_subscribe shall return NULL.] */
                BUFFER_delete(result);
                result = NULL;
            }
            else
            {
                STRING_HANDLE sub_trace = NULL;
                if (trace_log != NULL)
                {
                    sub_trace = STRING_construct_sprintf(" | PACKET_ID: %"PRIu16, packetId);
                }
                /* Codes_SRS_MQTT_CODEC_07_024: [mqtt_codec_subscribe shall iterate through count items in the subscribeList.] */
                if (addListItemsToSubscribePacket(result, subscribeList, count, sub_trace) != 0)
                {
                    /* Codes_SRS_MQTT_CODEC_07_025: [If any error is encountered then mqtt_codec_subscribe shall return NULL.] */
                    BUFFER_delete(result);
                    result = NULL;
                }
                else
                {

                    if (trace_log != NULL)
                    {
                        STRING_concat(trace_log, "SUBSCRIBE");
                    }
                    if (constructFixedHeader(result, SUBSCRIBE_TYPE, SUBSCRIBE_FIXED_HEADER_FLAG) != 0)
                    {
                        /* Codes_SRS_MQTT_CODEC_07_025: [If any error is encountered then mqtt_codec_subscribe shall return NULL.] */
                        BUFFER_delete(result);
                        result = NULL;
                    }
                    else
                    {
                        if (trace_log != NULL)
                        {
                            (void)STRING_concat_with_STRING(trace_log, sub_trace);
                        }
                    }
                }
                if (sub_trace != NULL)
                {
                    STRING_delete(sub_trace);
                }
            }
        }
    }
    return result;
}